

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_32x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  ushort uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  ushort uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  unkuint9 Var34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [13];
  undefined1 auVar37 [15];
  unkuint9 Var38;
  undefined1 auVar39 [11];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  int iVar44;
  undefined1 (*pauVar45) [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar56 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  short sVar72;
  short sVar75;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar76;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar77 [16];
  short sVar84;
  undefined1 in_XMM6 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  short sVar69;
  short sVar70;
  
  auVar1 = *(undefined1 (*) [16])above;
  auVar73 = *(undefined1 (*) [16])(above + 0x10);
  auVar19[0xd] = 0;
  auVar19._0_13_ = auVar1._0_13_;
  auVar19[0xe] = auVar1[7];
  uVar21 = auVar19._13_2_;
  auVar22[0xc] = auVar1[6];
  auVar22._0_12_ = auVar1._0_12_;
  auVar22._13_2_ = uVar21;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar1._0_11_;
  auVar24._12_3_ = auVar22._12_3_;
  auVar26[10] = auVar1[5];
  auVar26._0_10_ = auVar1._0_10_;
  auVar26._11_4_ = auVar24._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar1._0_9_;
  auVar28._10_5_ = auVar26._10_5_;
  auVar30[8] = auVar1[4];
  auVar30._0_8_ = auVar1._0_8_;
  auVar30._9_6_ = auVar28._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar30._8_7_;
  Var34 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar1[3]);
  auVar40._9_6_ = 0;
  auVar40._0_9_ = Var34;
  auVar35._1_10_ = SUB1510(auVar40 << 0x30,5);
  auVar35[0] = auVar1[2];
  auVar41._11_4_ = 0;
  auVar41._0_11_ = auVar35;
  auVar36._1_12_ = SUB1512(auVar41 << 0x20,3);
  auVar36[0] = auVar1[1];
  auVar64._0_2_ = CONCAT11(0,auVar1[0]);
  auVar64._2_13_ = auVar36;
  auVar64[0xf] = 0;
  auVar46._0_2_ = CONCAT11(0,auVar1[8]);
  bVar49 = auVar1[9];
  auVar46[2] = bVar49;
  auVar46[3] = 0;
  bVar50 = auVar1[10];
  auVar46[4] = bVar50;
  auVar46[5] = 0;
  bVar51 = auVar1[0xb];
  auVar46[6] = bVar51;
  auVar46[7] = 0;
  bVar52 = auVar1[0xc];
  auVar46[8] = bVar52;
  auVar46[9] = 0;
  bVar53 = auVar1[0xd];
  auVar46[10] = bVar53;
  auVar46[0xb] = 0;
  bVar54 = auVar1[0xe];
  auVar46[0xc] = bVar54;
  auVar46[0xd] = 0;
  bVar55 = auVar1[0xf];
  auVar46[0xe] = bVar55;
  auVar46[0xf] = 0;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar73._0_13_;
  auVar18[0xe] = auVar73[7];
  auVar20[0xc] = auVar73[6];
  auVar20._0_12_ = auVar73._0_12_;
  auVar20._13_2_ = auVar18._13_2_;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar73._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar25[10] = auVar73[5];
  auVar25._0_10_ = auVar73._0_10_;
  auVar25._11_4_ = auVar23._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar73._0_9_;
  auVar27._10_5_ = auVar25._10_5_;
  auVar29[8] = auVar73[4];
  auVar29._0_8_ = auVar73._0_8_;
  auVar29._9_6_ = auVar27._9_6_;
  auVar37._7_8_ = 0;
  auVar37._0_7_ = auVar29._8_7_;
  Var38 = CONCAT81(SUB158(auVar37 << 0x40,7),auVar73[3]);
  auVar42._9_6_ = 0;
  auVar42._0_9_ = Var38;
  auVar39._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar39[0] = auVar73[2];
  auVar43._11_4_ = 0;
  auVar43._0_11_ = auVar39;
  auVar32[2] = auVar73[1];
  auVar32._0_2_ = auVar73._0_2_;
  auVar32._3_12_ = SUB1512(auVar43 << 0x20,3);
  auVar71._0_2_ = auVar73._0_2_ & 0xff;
  auVar71._2_13_ = auVar32._2_13_;
  auVar71[0xf] = 0;
  auVar56._0_2_ = CONCAT11(0,auVar73[8]);
  bVar57 = auVar73[9];
  auVar56[2] = bVar57;
  auVar56[3] = 0;
  bVar58 = auVar73[10];
  auVar56[4] = bVar58;
  auVar56[5] = 0;
  bVar59 = auVar73[0xb];
  auVar56[6] = bVar59;
  auVar56[7] = 0;
  bVar60 = auVar73[0xc];
  auVar56[8] = bVar60;
  auVar56[9] = 0;
  bVar61 = auVar73[0xd];
  auVar56[10] = bVar61;
  auVar56[0xb] = 0;
  bVar62 = auVar73[0xe];
  auVar56[0xc] = bVar62;
  auVar56[0xd] = 0;
  bVar63 = auVar73[0xf];
  auVar56[0xe] = bVar63;
  auVar56[0xf] = 0;
  auVar73 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar74._0_4_ = auVar73._0_4_;
  auVar74._4_4_ = auVar74._0_4_;
  auVar74._8_4_ = auVar74._0_4_;
  auVar74._12_4_ = auVar74._0_4_;
  auVar1 = *(undefined1 (*) [16])left;
  sVar72 = auVar73._0_2_;
  auVar65._0_2_ = auVar64._0_2_ - sVar72;
  sVar75 = auVar73._2_2_;
  auVar65._2_2_ = auVar36._0_2_ - sVar75;
  auVar65._4_2_ = auVar35._0_2_ - sVar72;
  sVar69 = (short)Var34;
  auVar65._6_2_ = sVar69 - sVar75;
  auVar65._8_2_ = auVar30._8_2_ - sVar72;
  auVar65._10_2_ = auVar26._10_2_ - sVar75;
  auVar65._12_2_ = auVar22._12_2_ - sVar72;
  auVar65._14_2_ = (uVar21 >> 8) - sVar75;
  auVar93 = pabsw(in_XMM10,auVar65);
  auVar47._0_2_ = auVar46._0_2_ - sVar72;
  auVar47._2_2_ = (ushort)bVar49 - sVar75;
  auVar47._4_2_ = (ushort)bVar50 - sVar72;
  auVar47._6_2_ = (ushort)bVar51 - sVar75;
  auVar47._8_2_ = (ushort)bVar52 - sVar72;
  auVar47._10_2_ = (ushort)bVar53 - sVar75;
  auVar47._12_2_ = (ushort)bVar54 - sVar72;
  auVar47._14_2_ = (ushort)bVar55 - sVar75;
  auVar48 = pabsw(auVar47,auVar47);
  auVar66._0_2_ = auVar71._0_2_ - sVar72;
  auVar66._2_2_ = auVar32._2_2_ - sVar75;
  auVar66._4_2_ = auVar39._0_2_ - sVar72;
  sVar70 = (short)Var38;
  auVar66._6_2_ = sVar70 - sVar75;
  auVar66._8_2_ = auVar29._8_2_ - sVar72;
  auVar66._10_2_ = auVar25._10_2_ - sVar75;
  uVar31 = auVar18._13_2_ >> 8;
  auVar66._12_2_ = auVar20._12_2_ - sVar72;
  auVar66._14_2_ = uVar31 - sVar75;
  auVar85 = pabsw(in_XMM6,auVar66);
  auVar67._0_2_ = auVar56._0_2_ - sVar72;
  auVar67._2_2_ = (ushort)bVar57 - sVar75;
  auVar67._4_2_ = (ushort)bVar58 - sVar72;
  auVar67._6_2_ = (ushort)bVar59 - sVar75;
  auVar67._8_2_ = (ushort)bVar60 - sVar72;
  auVar67._10_2_ = (ushort)bVar61 - sVar75;
  auVar67._12_2_ = (ushort)bVar62 - sVar72;
  auVar67._14_2_ = (ushort)bVar63 - sVar75;
  auVar68 = pabsw(auVar67,auVar67);
  pauVar45 = (undefined1 (*) [16])(dst + 0x10);
  iVar44 = 0x10;
  auVar73 = _DAT_004d27e0;
  do {
    auVar77 = pshufb(auVar1,auVar73);
    sVar76 = auVar77._0_2_;
    sVar78 = auVar77._2_2_;
    sVar79 = auVar77._4_2_;
    sVar80 = auVar77._6_2_;
    sVar81 = auVar77._8_2_;
    sVar82 = auVar77._10_2_;
    sVar83 = auVar77._12_2_;
    sVar84 = auVar77._14_2_;
    auVar104._0_2_ = (auVar65._0_2_ + sVar76) - auVar64._0_2_;
    auVar104._2_2_ = (auVar65._2_2_ + sVar78) - auVar36._0_2_;
    auVar104._4_2_ = (auVar65._4_2_ + sVar79) - auVar35._0_2_;
    auVar104._6_2_ = (auVar65._6_2_ + sVar80) - sVar69;
    auVar104._8_2_ = (auVar65._8_2_ + sVar81) - auVar30._8_2_;
    auVar104._10_2_ = (auVar65._10_2_ + sVar82) - auVar26._10_2_;
    auVar104._12_2_ = (auVar65._12_2_ + sVar83) - auVar22._12_2_;
    auVar104._14_2_ = (auVar65._14_2_ + sVar84) - (uVar21 >> 8);
    auVar94 = pabsw(in_XMM11,auVar104);
    auVar86._0_2_ = (auVar65._0_2_ + sVar76) - sVar72;
    auVar86._2_2_ = (auVar65._2_2_ + sVar78) - sVar75;
    auVar86._4_2_ = (auVar65._4_2_ + sVar79) - sVar72;
    auVar86._6_2_ = (auVar65._6_2_ + sVar80) - sVar75;
    auVar86._8_2_ = (auVar65._8_2_ + sVar81) - sVar72;
    auVar86._10_2_ = (auVar65._10_2_ + sVar82) - sVar75;
    auVar86._12_2_ = (auVar65._12_2_ + sVar83) - sVar72;
    auVar86._14_2_ = (auVar65._14_2_ + sVar84) - sVar75;
    auVar86 = pabsw(auVar104,auVar86);
    auVar102._0_2_ = -(ushort)(auVar94._0_2_ < auVar93._0_2_);
    auVar102._2_2_ = -(ushort)(auVar94._2_2_ < auVar93._2_2_);
    auVar102._4_2_ = -(ushort)(auVar94._4_2_ < auVar93._4_2_);
    auVar102._6_2_ = -(ushort)(auVar94._6_2_ < auVar93._6_2_);
    auVar102._8_2_ = -(ushort)(auVar94._8_2_ < auVar93._8_2_);
    auVar102._10_2_ = -(ushort)(auVar94._10_2_ < auVar93._10_2_);
    auVar102._12_2_ = -(ushort)(auVar94._12_2_ < auVar93._12_2_);
    auVar102._14_2_ = -(ushort)(auVar94._14_2_ < auVar93._14_2_);
    auVar88._0_2_ = -(ushort)(auVar86._0_2_ < auVar93._0_2_);
    auVar88._2_2_ = -(ushort)(auVar86._2_2_ < auVar93._2_2_);
    auVar88._4_2_ = -(ushort)(auVar86._4_2_ < auVar93._4_2_);
    auVar88._6_2_ = -(ushort)(auVar86._6_2_ < auVar93._6_2_);
    auVar88._8_2_ = -(ushort)(auVar86._8_2_ < auVar93._8_2_);
    auVar88._10_2_ = -(ushort)(auVar86._10_2_ < auVar93._10_2_);
    auVar88._12_2_ = -(ushort)(auVar86._12_2_ < auVar93._12_2_);
    auVar88._14_2_ = -(ushort)(auVar86._14_2_ < auVar93._14_2_);
    auVar95._0_2_ = -(ushort)(auVar86._0_2_ < auVar94._0_2_);
    auVar95._2_2_ = -(ushort)(auVar86._2_2_ < auVar94._2_2_);
    auVar95._4_2_ = -(ushort)(auVar86._4_2_ < auVar94._4_2_);
    auVar95._6_2_ = -(ushort)(auVar86._6_2_ < auVar94._6_2_);
    auVar95._8_2_ = -(ushort)(auVar86._8_2_ < auVar94._8_2_);
    auVar95._10_2_ = -(ushort)(auVar86._10_2_ < auVar94._10_2_);
    auVar95._12_2_ = -(ushort)(auVar86._12_2_ < auVar94._12_2_);
    auVar95._14_2_ = -(ushort)(auVar86._14_2_ < auVar94._14_2_);
    auVar103._0_2_ = (auVar47._0_2_ + sVar76) - auVar46._0_2_;
    auVar103._2_2_ = (auVar47._2_2_ + sVar78) - (ushort)bVar49;
    auVar103._4_2_ = (auVar47._4_2_ + sVar79) - (ushort)bVar50;
    auVar103._6_2_ = (auVar47._6_2_ + sVar80) - (ushort)bVar51;
    auVar103._8_2_ = (auVar47._8_2_ + sVar81) - (ushort)bVar52;
    auVar103._10_2_ = (auVar47._10_2_ + sVar82) - (ushort)bVar53;
    auVar103._12_2_ = (auVar47._12_2_ + sVar83) - (ushort)bVar54;
    auVar103._14_2_ = (auVar47._14_2_ + sVar84) - (ushort)bVar55;
    auVar104 = pabsw(auVar103,auVar103);
    auVar94._0_2_ = (auVar47._0_2_ + sVar76) - sVar72;
    auVar94._2_2_ = (auVar47._2_2_ + sVar78) - sVar75;
    auVar94._4_2_ = (auVar47._4_2_ + sVar79) - sVar72;
    auVar94._6_2_ = (auVar47._6_2_ + sVar80) - sVar75;
    auVar94._8_2_ = (auVar47._8_2_ + sVar81) - sVar72;
    auVar94._10_2_ = (auVar47._10_2_ + sVar82) - sVar75;
    auVar94._12_2_ = (auVar47._12_2_ + sVar83) - sVar72;
    auVar94._14_2_ = (auVar47._14_2_ + sVar84) - sVar75;
    auVar86 = pabsw(auVar94,auVar94);
    auVar90._0_2_ = -(ushort)(auVar104._0_2_ < auVar48._0_2_);
    auVar90._2_2_ = -(ushort)(auVar104._2_2_ < auVar48._2_2_);
    auVar90._4_2_ = -(ushort)(auVar104._4_2_ < auVar48._4_2_);
    auVar90._6_2_ = -(ushort)(auVar104._6_2_ < auVar48._6_2_);
    auVar90._8_2_ = -(ushort)(auVar104._8_2_ < auVar48._8_2_);
    auVar90._10_2_ = -(ushort)(auVar104._10_2_ < auVar48._10_2_);
    auVar90._12_2_ = -(ushort)(auVar104._12_2_ < auVar48._12_2_);
    auVar90._14_2_ = -(ushort)(auVar104._14_2_ < auVar48._14_2_);
    auVar97._0_2_ = -(ushort)(auVar86._0_2_ < auVar48._0_2_);
    auVar97._2_2_ = -(ushort)(auVar86._2_2_ < auVar48._2_2_);
    auVar97._4_2_ = -(ushort)(auVar86._4_2_ < auVar48._4_2_);
    auVar97._6_2_ = -(ushort)(auVar86._6_2_ < auVar48._6_2_);
    auVar97._8_2_ = -(ushort)(auVar86._8_2_ < auVar48._8_2_);
    auVar97._10_2_ = -(ushort)(auVar86._10_2_ < auVar48._10_2_);
    auVar97._12_2_ = -(ushort)(auVar86._12_2_ < auVar48._12_2_);
    auVar97._14_2_ = -(ushort)(auVar86._14_2_ < auVar48._14_2_);
    auVar105._0_2_ = -(ushort)(auVar86._0_2_ < auVar104._0_2_);
    auVar105._2_2_ = -(ushort)(auVar86._2_2_ < auVar104._2_2_);
    auVar105._4_2_ = -(ushort)(auVar86._4_2_ < auVar104._4_2_);
    auVar105._6_2_ = -(ushort)(auVar86._6_2_ < auVar104._6_2_);
    auVar105._8_2_ = -(ushort)(auVar86._8_2_ < auVar104._8_2_);
    auVar105._10_2_ = -(ushort)(auVar86._10_2_ < auVar104._10_2_);
    auVar105._12_2_ = -(ushort)(auVar86._12_2_ < auVar104._12_2_);
    auVar105._14_2_ = -(ushort)(auVar86._14_2_ < auVar104._14_2_);
    auVar86 = ~(auVar88 | auVar102) & auVar77 |
              (~auVar95 & auVar64 | auVar74 & auVar95) & (auVar88 | auVar102);
    auVar94 = ~(auVar97 | auVar90) & auVar77 |
              (~auVar105 & auVar46 | auVar74 & auVar105) & (auVar97 | auVar90);
    sVar2 = auVar86._0_2_;
    sVar3 = auVar86._2_2_;
    sVar4 = auVar86._4_2_;
    sVar5 = auVar86._6_2_;
    sVar6 = auVar86._8_2_;
    sVar7 = auVar86._10_2_;
    sVar8 = auVar86._12_2_;
    sVar9 = auVar86._14_2_;
    sVar10 = auVar94._0_2_;
    sVar11 = auVar94._2_2_;
    sVar12 = auVar94._4_2_;
    sVar13 = auVar94._6_2_;
    sVar14 = auVar94._8_2_;
    sVar15 = auVar94._10_2_;
    sVar16 = auVar94._12_2_;
    sVar17 = auVar94._14_2_;
    auVar87._0_2_ = (auVar66._0_2_ + sVar76) - auVar71._0_2_;
    auVar87._2_2_ = (auVar66._2_2_ + sVar78) - auVar32._2_2_;
    auVar87._4_2_ = (auVar66._4_2_ + sVar79) - auVar39._0_2_;
    auVar87._6_2_ = (auVar66._6_2_ + sVar80) - sVar70;
    auVar87._8_2_ = (auVar66._8_2_ + sVar81) - auVar29._8_2_;
    auVar87._10_2_ = (auVar66._10_2_ + sVar82) - auVar25._10_2_;
    auVar87._12_2_ = (auVar66._12_2_ + sVar83) - auVar20._12_2_;
    auVar87._14_2_ = (auVar66._14_2_ + sVar84) - uVar31;
    auVar88 = pabsw(auVar87,auVar87);
    auVar91._0_2_ = (auVar66._0_2_ + sVar76) - sVar72;
    auVar91._2_2_ = (auVar66._2_2_ + sVar78) - sVar75;
    auVar91._4_2_ = (auVar66._4_2_ + sVar79) - sVar72;
    auVar91._6_2_ = (auVar66._6_2_ + sVar80) - sVar75;
    auVar91._8_2_ = (auVar66._8_2_ + sVar81) - sVar72;
    auVar91._10_2_ = (auVar66._10_2_ + sVar82) - sVar75;
    auVar91._12_2_ = (auVar66._12_2_ + sVar83) - sVar72;
    auVar91._14_2_ = (auVar66._14_2_ + sVar84) - sVar75;
    auVar104 = pabsw(auVar91,auVar91);
    auVar98._0_2_ = -(ushort)(auVar88._0_2_ < auVar85._0_2_);
    auVar98._2_2_ = -(ushort)(auVar88._2_2_ < auVar85._2_2_);
    auVar98._4_2_ = -(ushort)(auVar88._4_2_ < auVar85._4_2_);
    auVar98._6_2_ = -(ushort)(auVar88._6_2_ < auVar85._6_2_);
    auVar98._8_2_ = -(ushort)(auVar88._8_2_ < auVar85._8_2_);
    auVar98._10_2_ = -(ushort)(auVar88._10_2_ < auVar85._10_2_);
    auVar98._12_2_ = -(ushort)(auVar88._12_2_ < auVar85._12_2_);
    auVar98._14_2_ = -(ushort)(auVar88._14_2_ < auVar85._14_2_);
    auVar96._0_2_ = -(ushort)(auVar104._0_2_ < auVar85._0_2_);
    auVar96._2_2_ = -(ushort)(auVar104._2_2_ < auVar85._2_2_);
    auVar96._4_2_ = -(ushort)(auVar104._4_2_ < auVar85._4_2_);
    auVar96._6_2_ = -(ushort)(auVar104._6_2_ < auVar85._6_2_);
    auVar96._8_2_ = -(ushort)(auVar104._8_2_ < auVar85._8_2_);
    auVar96._10_2_ = -(ushort)(auVar104._10_2_ < auVar85._10_2_);
    auVar96._12_2_ = -(ushort)(auVar104._12_2_ < auVar85._12_2_);
    auVar96._14_2_ = -(ushort)(auVar104._14_2_ < auVar85._14_2_);
    auVar89._0_2_ = -(ushort)(auVar104._0_2_ < auVar88._0_2_);
    auVar89._2_2_ = -(ushort)(auVar104._2_2_ < auVar88._2_2_);
    auVar89._4_2_ = -(ushort)(auVar104._4_2_ < auVar88._4_2_);
    auVar89._6_2_ = -(ushort)(auVar104._6_2_ < auVar88._6_2_);
    auVar89._8_2_ = -(ushort)(auVar104._8_2_ < auVar88._8_2_);
    auVar89._10_2_ = -(ushort)(auVar104._10_2_ < auVar88._10_2_);
    auVar89._12_2_ = -(ushort)(auVar104._12_2_ < auVar88._12_2_);
    auVar89._14_2_ = -(ushort)(auVar104._14_2_ < auVar88._14_2_);
    auVar99._0_2_ = (auVar67._0_2_ + sVar76) - auVar56._0_2_;
    auVar99._2_2_ = (auVar67._2_2_ + sVar78) - (ushort)bVar57;
    auVar99._4_2_ = (auVar67._4_2_ + sVar79) - (ushort)bVar58;
    auVar99._6_2_ = (auVar67._6_2_ + sVar80) - (ushort)bVar59;
    auVar99._8_2_ = (auVar67._8_2_ + sVar81) - (ushort)bVar60;
    auVar99._10_2_ = (auVar67._10_2_ + sVar82) - (ushort)bVar61;
    auVar99._12_2_ = (auVar67._12_2_ + sVar83) - (ushort)bVar62;
    auVar99._14_2_ = (auVar67._14_2_ + sVar84) - (ushort)bVar63;
    auVar104 = pabsw(auVar99,auVar99);
    auVar92._0_2_ = (auVar67._0_2_ + sVar76) - sVar72;
    auVar92._2_2_ = (auVar67._2_2_ + sVar78) - sVar75;
    auVar92._4_2_ = (auVar67._4_2_ + sVar79) - sVar72;
    auVar92._6_2_ = (auVar67._6_2_ + sVar80) - sVar75;
    auVar92._8_2_ = (auVar67._8_2_ + sVar81) - sVar72;
    auVar92._10_2_ = (auVar67._10_2_ + sVar82) - sVar75;
    auVar92._12_2_ = (auVar67._12_2_ + sVar83) - sVar72;
    auVar92._14_2_ = (auVar67._14_2_ + sVar84) - sVar75;
    auVar88 = pabsw(auVar92,auVar92);
    auVar106._0_2_ = -(ushort)(auVar104._0_2_ < auVar68._0_2_);
    auVar106._2_2_ = -(ushort)(auVar104._2_2_ < auVar68._2_2_);
    auVar106._4_2_ = -(ushort)(auVar104._4_2_ < auVar68._4_2_);
    auVar106._6_2_ = -(ushort)(auVar104._6_2_ < auVar68._6_2_);
    auVar106._8_2_ = -(ushort)(auVar104._8_2_ < auVar68._8_2_);
    auVar106._10_2_ = -(ushort)(auVar104._10_2_ < auVar68._10_2_);
    auVar106._12_2_ = -(ushort)(auVar104._12_2_ < auVar68._12_2_);
    auVar106._14_2_ = -(ushort)(auVar104._14_2_ < auVar68._14_2_);
    auVar101._0_2_ = -(ushort)(auVar88._0_2_ < auVar68._0_2_);
    auVar101._2_2_ = -(ushort)(auVar88._2_2_ < auVar68._2_2_);
    auVar101._4_2_ = -(ushort)(auVar88._4_2_ < auVar68._4_2_);
    auVar101._6_2_ = -(ushort)(auVar88._6_2_ < auVar68._6_2_);
    auVar101._8_2_ = -(ushort)(auVar88._8_2_ < auVar68._8_2_);
    auVar101._10_2_ = -(ushort)(auVar88._10_2_ < auVar68._10_2_);
    auVar101._12_2_ = -(ushort)(auVar88._12_2_ < auVar68._12_2_);
    auVar101._14_2_ = -(ushort)(auVar88._14_2_ < auVar68._14_2_);
    auVar100._0_2_ = -(ushort)(auVar88._0_2_ < auVar104._0_2_);
    auVar100._2_2_ = -(ushort)(auVar88._2_2_ < auVar104._2_2_);
    auVar100._4_2_ = -(ushort)(auVar88._4_2_ < auVar104._4_2_);
    auVar100._6_2_ = -(ushort)(auVar88._6_2_ < auVar104._6_2_);
    auVar100._8_2_ = -(ushort)(auVar88._8_2_ < auVar104._8_2_);
    auVar100._10_2_ = -(ushort)(auVar88._10_2_ < auVar104._10_2_);
    auVar100._12_2_ = -(ushort)(auVar88._12_2_ < auVar104._12_2_);
    auVar100._14_2_ = -(ushort)(auVar88._14_2_ < auVar104._14_2_);
    auVar88 = ~(auVar96 | auVar98) & auVar77 |
              (~auVar89 & auVar71 | auVar74 & auVar89) & (auVar96 | auVar98);
    auVar77 = ~(auVar101 | auVar106) & auVar77 |
              (~auVar100 & auVar56 | auVar74 & auVar100) & (auVar101 | auVar106);
    sVar76 = auVar88._0_2_;
    sVar78 = auVar88._2_2_;
    in_XMM11[1] = (0 < sVar78) * (sVar78 < 0x100) * auVar88[2] - (0xff < sVar78);
    in_XMM11[0] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[0] - (0xff < sVar76);
    sVar76 = auVar88._4_2_;
    in_XMM11[2] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[4] - (0xff < sVar76);
    sVar76 = auVar88._6_2_;
    in_XMM11[3] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[6] - (0xff < sVar76);
    sVar76 = auVar88._8_2_;
    in_XMM11[4] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[8] - (0xff < sVar76);
    sVar76 = auVar88._10_2_;
    in_XMM11[5] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[10] - (0xff < sVar76);
    sVar76 = auVar88._12_2_;
    in_XMM11[6] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[0xc] - (0xff < sVar76);
    sVar76 = auVar88._14_2_;
    in_XMM11[7] = (0 < sVar76) * (sVar76 < 0x100) * auVar88[0xe] - (0xff < sVar76);
    sVar76 = auVar77._0_2_;
    in_XMM11[8] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[0] - (0xff < sVar76);
    sVar76 = auVar77._2_2_;
    in_XMM11[9] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[2] - (0xff < sVar76);
    sVar76 = auVar77._4_2_;
    in_XMM11[10] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[4] - (0xff < sVar76);
    sVar76 = auVar77._6_2_;
    in_XMM11[0xb] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[6] - (0xff < sVar76);
    sVar76 = auVar77._8_2_;
    in_XMM11[0xc] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[8] - (0xff < sVar76);
    sVar76 = auVar77._10_2_;
    in_XMM11[0xd] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[10] - (0xff < sVar76);
    sVar76 = auVar77._12_2_;
    in_XMM11[0xe] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[0xc] - (0xff < sVar76);
    sVar76 = auVar77._14_2_;
    in_XMM11[0xf] = (0 < sVar76) * (sVar76 < 0x100) * auVar77[0xe] - (0xff < sVar76);
    pauVar45[-1][0] = (0 < sVar2) * (sVar2 < 0x100) * auVar86[0] - (0xff < sVar2);
    pauVar45[-1][1] = (0 < sVar3) * (sVar3 < 0x100) * auVar86[2] - (0xff < sVar3);
    pauVar45[-1][2] = (0 < sVar4) * (sVar4 < 0x100) * auVar86[4] - (0xff < sVar4);
    pauVar45[-1][3] = (0 < sVar5) * (sVar5 < 0x100) * auVar86[6] - (0xff < sVar5);
    pauVar45[-1][4] = (0 < sVar6) * (sVar6 < 0x100) * auVar86[8] - (0xff < sVar6);
    pauVar45[-1][5] = (0 < sVar7) * (sVar7 < 0x100) * auVar86[10] - (0xff < sVar7);
    pauVar45[-1][6] = (0 < sVar8) * (sVar8 < 0x100) * auVar86[0xc] - (0xff < sVar8);
    pauVar45[-1][7] = (0 < sVar9) * (sVar9 < 0x100) * auVar86[0xe] - (0xff < sVar9);
    pauVar45[-1][8] = (0 < sVar10) * (sVar10 < 0x100) * auVar94[0] - (0xff < sVar10);
    pauVar45[-1][9] = (0 < sVar11) * (sVar11 < 0x100) * auVar94[2] - (0xff < sVar11);
    pauVar45[-1][10] = (0 < sVar12) * (sVar12 < 0x100) * auVar94[4] - (0xff < sVar12);
    pauVar45[-1][0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar94[6] - (0xff < sVar13);
    pauVar45[-1][0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar94[8] - (0xff < sVar14);
    pauVar45[-1][0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar94[10] - (0xff < sVar15);
    pauVar45[-1][0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar94[0xc] - (0xff < sVar16);
    pauVar45[-1][0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar94[0xe] - (0xff < sVar17);
    *pauVar45 = in_XMM11;
    auVar77._0_2_ = auVar73._0_2_ + 1;
    auVar77._2_2_ = auVar73._2_2_ + 1;
    auVar77._4_2_ = auVar73._4_2_ + 1;
    auVar77._6_2_ = auVar73._6_2_ + 1;
    auVar77._8_2_ = auVar73._8_2_ + 1;
    auVar77._10_2_ = auVar73._10_2_ + 1;
    auVar77._12_2_ = auVar73._12_2_ + 1;
    auVar77._14_2_ = auVar73._14_2_ + 1;
    pauVar45 = (undefined1 (*) [16])(*pauVar45 + stride);
    iVar44 = iVar44 + -1;
    auVar73 = auVar77;
  } while (iVar44 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}